

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFLAG_Register.cpp
# Opt level: O3

bool __thiscall SFLAG_Register::getFlag(SFLAG_Register *this,string *flagName)

{
  undefined1 uVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)flagName);
  if (iVar2 == 0) {
    uVar1 = this->registerStore[0];
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)flagName);
    if (iVar2 == 0) {
      uVar1 = this->registerStore[2];
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)flagName);
      if (iVar2 == 0) {
        uVar1 = this->registerStore[4];
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)flagName);
        if (iVar2 == 0) {
          uVar1 = this->registerStore[6];
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)flagName);
          if (iVar2 == 0) {
            uVar1 = this->registerStore[7];
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)flagName);
            if (iVar2 == 0) {
              uVar1 = this->registerStore[8];
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)flagName);
              if (iVar2 == 0) {
                uVar1 = this->registerStore[9];
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)flagName);
                if (iVar2 == 0) {
                  uVar1 = this->registerStore[0xb];
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)flagName);
                  if (iVar2 == 0) {
                    uVar1 = this->registerStore[0xe];
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)flagName);
                    if (iVar2 == 0) {
                      uVar1 = this->registerStore[0x10];
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)flagName);
                      if (iVar2 == 0) {
                        uVar1 = this->registerStore[0x11];
                      }
                      else {
                        uVar1 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)uVar1;
}

Assistant:

bool SFLAG_Register::getFlag(std::string flagName)
{
	if (flagName == "CF") return getFlag(0);
	else if (flagName == "PF") return getFlag(2);
	else if (flagName == "AF") return getFlag(4);
	else if (flagName == "ZF") return getFlag(6);
	else if (flagName == "SF") return getFlag(7);
	else if (flagName == "TP") return getFlag(8);
	else if (flagName == "IF") return getFlag(9);
	else if (flagName == "OF") return getFlag(11);
	else if (flagName == "NT") return getFlag(14);
	else if (flagName == "RF") return getFlag(16);
	else if (flagName == "VM") return getFlag(17);
	else
	{
		// TODO: throw a triple-step error.
		// Just return 0 for now.
		return 0;
	}
}